

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O1

char * callscrn_num_to_string
                 (char *string_buf,size_t string_buf_len,uint8_t *num_buf,size_t num_buf_len)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  pcVar1 = string_buf;
  if (num_buf_len != 0) {
    uVar2 = 0;
    lVar4 = 0;
    do {
      *string_buf = ""[num_buf[lVar4] >> 4];
      uVar3 = uVar2 + 1;
      if (uVar3 < string_buf_len - 1) {
        string_buf[1] = ""[num_buf[lVar4] & 0xf];
        string_buf = string_buf + 2;
        uVar3 = uVar2 + 2;
        bVar5 = string_buf_len - 1 <= uVar3;
      }
      else {
        string_buf = string_buf + 1;
        bVar5 = true;
      }
    } while ((!bVar5) && (bVar5 = num_buf_len - 1 != lVar4, uVar2 = uVar3, lVar4 = lVar4 + 1, bVar5)
            );
  }
  *string_buf = '\0';
  return pcVar1;
}

Assistant:

char* callscrn_num_to_string(char *string_buf, size_t string_buf_len, uint8_t *num_buf, size_t num_buf_len) {
    char  *pstr = string_buf;
    size_t i, j;

    j = 0;

    for (i = 0; i < num_buf_len; i++) {
        int pn_digit = num_buf[i] >> 4;

        *pstr++ = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;

        pn_digit = num_buf[i] & 0x0f;
        *pstr++  = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;
    }

    *pstr = '\0';
    return string_buf;
}